

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewFuncStart(LocationUpdater *this,BinaryLocation oldAddr)

{
  const_iterator cVar1;
  BinaryLocation *pBVar2;
  Function *local_20;
  Function *func;
  
  local_20 = FuncAddrMap::getStart(&this->oldFuncAddrMap,oldAddr);
  if ((local_20 != (Function *)0x0) &&
     (cVar1 = std::
              _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->newLocations->functions)._M_h,&local_20),
     cVar1.
     super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
     ._M_cur != (__node_type *)0x0)) {
    if ((local_20->funcLocation).start == oldAddr) {
      pBVar2 = (BinaryLocation *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                      ._M_cur + 0x10);
    }
    else {
      if ((local_20->funcLocation).declarations != oldAddr) {
        handle_unreachable("invalid func start",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                           ,0x224);
      }
      pBVar2 = (BinaryLocation *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                      ._M_cur + 0x14);
    }
    return *pBVar2;
  }
  return 0;
}

Assistant:

BinaryLocation getNewFuncStart(BinaryLocation oldAddr) const {
    if (auto* func = oldFuncAddrMap.getStart(oldAddr)) {
      // The function might have been optimized away, check.
      auto iter = newLocations.functions.find(func);
      if (iter != newLocations.functions.end()) {
        auto oldLocations = func->funcLocation;
        auto newLocations = iter->second;
        if (oldAddr == oldLocations.start) {
          return newLocations.start;
        } else if (oldAddr == oldLocations.declarations) {
          return newLocations.declarations;
        } else {
          WASM_UNREACHABLE("invalid func start");
        }
      }
    }
    return 0;
  }